

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.cpp
# Opt level: O3

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::NamedTest::result(NamedTest *this)

{
  NamedResult *this_00;
  long in_RSI;
  _Head_base<0UL,_const_oout::Result_*,_false> local_30;
  shared_ptr<const_oout::Result> local_28;
  
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x10))(&local_30);
  this_00 = (NamedResult *)operator_new(0x38);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)&local_30);
  NamedResult::NamedResult(this_00,(string *)(in_RSI + 8),&local_28);
  if (local_28.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Test)._vptr_Test = (_func_int **)this_00;
  if (local_30._M_head_impl != (Result *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Result[1])();
  }
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> NamedTest::result() const
{
	return make_unique<NamedResult>(name, test->result());
}